

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void container_suite::test_object_empty(void)

{
  char cVar1;
  bool bVar2;
  encoder_type encoder;
  ostringstream result;
  char local_1cc [4];
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined **local_1a8;
  ostringstream *local_1a0;
  long local_188 [4];
  int aiStack_168 [20];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
  local_1a8 = &PTR__base_00118c10;
  bVar2 = *(int *)((long)aiStack_168 + *(long *)(local_188[0] + -0x18)) == 0;
  local_1a0 = (ostringstream *)local_188;
  if (bVar2) {
    local_1cc[0] = 0x7b;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_188,local_1cc,1);
  }
  local_1c8[0] = (long *)(ulong)bVar2;
  local_1cc[0] = '\x01';
  local_1cc[1] = '\0';
  local_1cc[2] = '\0';
  local_1cc[3] = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::begin_object>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3a8,"void container_suite::test_object_empty()",local_1c8,local_1cc);
  cVar1 = (*(code *)local_1a8[2])(&local_1a8,1);
  if (cVar1 != '\0') {
    (*(code *)local_1a8[3])(&local_1a8,0x7d);
  }
  local_1c8[0] = (long *)(ulong)(cVar1 != '\0');
  local_1cc[0] = '\x01';
  local_1cc[1] = '\0';
  local_1cc[2] = '\0';
  local_1cc[3] = '\0';
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value<token::end_object>()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3a9,"void container_suite::test_object_empty()",local_1c8,local_1cc);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[3]>
            ("result.str()","\"{}\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3aa,"void container_suite::test_object_empty()",local_1c8,"{}");
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  (*(code *)*local_1a8)();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void test_object_empty()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::begin_object>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value<token::end_object>(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "{}");
}